

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x25519.h
# Opt level: O0

int hydro_x25519_canon(hydro_x25519_limb_t *x)

{
  ulong uVar1;
  hydro_x25519_limb_t hVar2;
  ulong uVar3;
  long in_RDI;
  int i;
  hydro_x25519_limb_t res;
  hydro_x25519_limb_t carry0;
  hydro_x25519_sdlimb_t carry;
  int local_2c;
  hydro_x25519_limb_t in_stack_ffffffffffffffd8;
  ulong uVar4;
  hydro_x25519_limb_t *x_00;
  ulong local_18;
  long local_10;
  
  x_00 = (hydro_x25519_limb_t *)0x13;
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    hVar2 = hydro_x25519_adc0((hydro_x25519_limb_t *)&stack0xffffffffffffffe0,
                              *(hydro_x25519_limb_t *)(in_RDI + (long)local_2c * 8));
    *(hydro_x25519_limb_t *)(in_RDI + (long)local_2c * 8) = hVar2;
  }
  hydro_x25519_propagate(x_00,in_stack_ffffffffffffffd8);
  local_10 = -1;
  local_18 = 0xffffffffffffffed;
  uVar4 = 0;
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    uVar1 = *(ulong *)(in_RDI + (long)local_2c * 8);
    uVar3 = local_18 + uVar1;
    local_18 = local_10 + (ulong)CARRY8(local_18,uVar1);
    *(ulong *)(in_RDI + (long)local_2c * 8) = uVar3;
    uVar4 = uVar4 | uVar3;
    local_10 = (long)local_18 >> 0x3f;
  }
  return (uVar4 != 0) - 1;
}

Assistant:

static int
hydro_x25519_canon(hydro_x25519_fe x)
{
    hydro_x25519_sdlimb_t carry;
    hydro_x25519_limb_t   carry0 = 19;
    hydro_x25519_limb_t   res;
    int                   i;

    for (i = 0; i < hydro_x25519_NLIMBS; i++) {
        x[i] = hydro_x25519_adc0(&carry0, x[i]);
    }
    hydro_x25519_propagate(x, carry0);
    carry = -19;
    res   = 0;
    for (i = 0; i < hydro_x25519_NLIMBS; i++) {
        res |= x[i] = (hydro_x25519_limb_t) (carry += x[i]);
        carry >>= hydro_x25519_WBITS;
    }
    return ((hydro_x25519_dlimb_t) res - 1) >> hydro_x25519_WBITS;
}